

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSyncTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Stress::FenceSyncCase::FenceSyncCase
          (FenceSyncCase *this,Context *context,char *name,char *description,int numSyncs,
          deUint32 waitCommand)

{
  int iVar1;
  deUint32 seed;
  undefined4 extraout_var;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_0212e880;
  (this->super_TestCase).m_context = context;
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1),
             context->m_testCtx->m_log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FenceSyncCase_02150b48;
  *(int *)&(this->super_CallLogWrapper).field_0x14 = numSyncs;
  this->m_waitCommand = waitCommand;
  this->m_program = (ShaderProgram *)0x0;
  (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_iterNdx = 0;
  seed = deStringHash(name);
  deRandom_init(&(this->m_rnd).m_rnd,seed);
  return;
}

Assistant:

FenceSyncCase::FenceSyncCase (Context& context, const char* name, const char* description, int numSyncs, deUint32 waitCommand)
	: TestCase			(context, name, description)
	, CallLogWrapper	(context.getRenderContext().getFunctions(), context.getTestContext().getLog())
	, m_numSyncs		(numSyncs)
	, m_waitCommand		(waitCommand)
	, m_program			(DE_NULL)
	, m_syncObjects		(DE_NULL)
	, m_iterNdx			(0)
	, m_rnd				(deStringHash(name))
{
}